

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O1

FileInfo * __thiscall
llbuild::basic::ChecksumOnlyFileSystem::getLinkInfo
          (FileInfo *__return_storage_ptr__,ChecksumOnlyFileSystem *this,string *path)

{
  ssize_t sVar1;
  size_t sVar2;
  uchar *in_RCX;
  size_t n;
  uchar *d;
  char buff [4096];
  long *local_1108 [2];
  long local_10f8 [2];
  undefined **local_10e8;
  undefined8 local_10e0;
  undefined8 *local_10d8;
  MD5 local_10d0;
  uchar local_1028 [4096];
  
  (*((this->impl)._M_t.
     super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
     ._M_t.
     super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
     .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl)->_vptr_FileSystem[8])
            ();
  __return_storage_ptr__->device = 0;
  __return_storage_ptr__->inode = 0;
  (__return_storage_ptr__->modTime).seconds = 0;
  (__return_storage_ptr__->modTime).nanoseconds = 0;
  sVar1 = readlink((path->_M_dataplus)._M_p,(char *)local_1028,0xfff);
  if (sVar1 == -1) {
    (__return_storage_ptr__->checksum).bytes[0x10] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x11] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x12] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x13] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x14] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x15] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x16] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x17] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x18] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x19] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1a] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1b] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1c] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1d] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1e] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1f] = '\0';
    (__return_storage_ptr__->checksum).bytes[0] = '\0';
    (__return_storage_ptr__->checksum).bytes[1] = '\0';
    (__return_storage_ptr__->checksum).bytes[2] = '\0';
    (__return_storage_ptr__->checksum).bytes[3] = '\0';
    (__return_storage_ptr__->checksum).bytes[4] = '\0';
    (__return_storage_ptr__->checksum).bytes[5] = '\0';
    (__return_storage_ptr__->checksum).bytes[6] = '\0';
    (__return_storage_ptr__->checksum).bytes[7] = '\0';
    (__return_storage_ptr__->checksum).bytes[8] = '\0';
    (__return_storage_ptr__->checksum).bytes[9] = '\0';
    (__return_storage_ptr__->checksum).bytes[10] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xb] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xc] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xd] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xe] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xf] = '\0';
  }
  else {
    local_1028[sVar1] = '\0';
    d = local_1028;
    local_1108[0] = local_10f8;
    sVar2 = strlen((char *)d);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1108,d,local_1028 + sVar2);
    local_10e0 = 0;
    local_10e8 = &PTR_copy_001d5e40;
    local_10d8 = local_1108;
    llvm::MD5::MD5(&local_10d0,d,n,in_RCX);
    (*(code *)local_10e8[3])(&local_10e8,*local_10d8,local_10d8[1]);
    (*(code *)local_10e8[2])(&local_10e8);
    (*(code *)*local_10e8)(&local_10e8,&__return_storage_ptr__->checksum);
    if (local_1108[0] != local_10f8) {
      operator_delete(local_1108[0],local_10f8[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual FileInfo getLinkInfo(const std::string& path) override {
    auto info = impl->getLinkInfo(path);

    info.device = 0;
    info.inode = 0;
    info.modTime = FileTimestamp();
    info.modTime.seconds = 0;
    info.modTime.nanoseconds = 0;

#ifndef _WIN32
    char buff[PATH_MAX];
    ssize_t len = ::readlink(path.c_str(), buff, sizeof(buff)-1);
    if (len != -1) {
      buff[len] = '\0';
      PlatformSpecificHasher(std::string(buff)).readPathStringAndDigest(info.checksum);
    } else {
      info.checksum = {0};
    }
#else
    info.checksum = impl->getFileChecksum(path);
#endif
    return info;
  }